

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mctools_impl_view_no_winnamespace(mcu8str *path)

{
  int iVar1;
  mcu8str *in_RSI;
  mcu8str *in_RDI;
  
  mcu8str_view_str(in_RDI,in_RSI);
  iVar1 = mctools_impl_has_winnamespace(in_RSI);
  if (iVar1 != 0) {
    in_RDI->c_str = in_RDI->c_str + 4;
    in_RDI->size = in_RDI->size - 4;
  }
  return in_RDI;
}

Assistant:

mcu8str mctools_impl_view_no_winnamespace( const mcu8str * path )
  {
    //Windows paths starting with "\\?\" are a bit special. For our purposes we
    //simply skip those initial characters. See more on:
    //https://learn.microsoft.com/en-us/windows/win32/fileio/naming-a-file
    mcu8str res = mcu8str_view_str( path );
    if ( mctools_impl_has_winnamespace(path) ) {
      //Begins with "<sep><sep>?<sep>", modify the view:
      res.c_str += 4;
        res.size -= 4;
    }
    return res;
  }